

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O3

void juzzlin::SimpleLogger::setLevelSymbol(Level level,string *symbol)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  Level local_34;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar1 = (symbol->_M_dataplus)._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + symbol->_M_string_length);
  local_34 = level;
  pmVar2 = std::
           map<juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<juzzlin::SimpleLogger::Level>,_std::allocator<std::pair<const_juzzlin::SimpleLogger::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)Impl::m_symbols_abi_cxx11_,&local_34);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void SimpleLogger::setLevelSymbol(Level level, std::string symbol)
{
    Impl::setLevelSymbol(level, symbol);
}